

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O2

Ssc_Man_t * Ssc_ManStart(Gia_Man_t *pAig,Gia_Man_t *pCare,Ssc_Pars_t *pPars)

{
  byte bVar1;
  int iVar2;
  sat_solver *psVar3;
  int **ppiVar4;
  int iVar5;
  uint uVar6;
  Ssc_Man_t *p;
  Gia_Man_t *p_00;
  Vec_Int_t *pVVar7;
  char *pcVar8;
  Ssc_Man_t *pSVar9;
  
  pSVar9 = (Ssc_Man_t *)0x1;
  p = (Ssc_Man_t *)calloc(1,0xd0);
  p->pPars = pPars;
  p->pAig = pAig;
  p->pCare = pCare;
  p_00 = Gia_ManDupDfs(pCare);
  p->pFraig = p_00;
  if ((p_00->vHTable).nSize != 0) {
    pcVar8 = "Vec_IntSize(&p->pFraig->vHTable) == 0";
    uVar6 = 0x58;
LAB_005138ba:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssc/sscCore.c"
                  ,uVar6,"Ssc_Man_t *Ssc_ManStart(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)");
  }
  iVar5 = Gia_ManHasDangling(p_00);
  if (iVar5 != 0) {
    pcVar8 = "!Gia_ManHasDangling(p->pFraig)";
    uVar6 = 0x59;
    goto LAB_005138ba;
  }
  Gia_ManInvertPos(p_00);
  Ssc_ManStartSolver(p);
  if (p->pSat == (sat_solver *)0x0) {
    pcVar8 = "Constraints are UNSAT after propagation.";
  }
  else {
    pVVar7 = Ssc_ManFindPivotSat(p);
    p->vPivot = pVVar7;
    if (pVVar7 == (Vec_Int_t *)0x0) {
      puts("Conflict limit is reached while trying to find one SAT assignment.");
      Ssc_ManStop(p);
      return (Ssc_Man_t *)0x0;
    }
    if (pVVar7 != (Vec_Int_t *)0x1) {
      psVar3 = p->pSat;
      if (psVar3->qhead != psVar3->qtail) {
        __assert_fail("s->qhead == s->qtail",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                      ,0x137,"void sat_solver_bookmark(sat_solver *)");
      }
      iVar5 = psVar3->size;
      psVar3->iVarPivot = iVar5;
      psVar3->iTrailPivot = psVar3->qhead;
      *(undefined8 *)(psVar3->Mem).BookMarkE = *(undefined8 *)(psVar3->Mem).nEntries;
      iVar2 = (psVar3->Mem).iPage[0];
      bVar1 = (byte)(psVar3->Mem).nPageSize;
      ppiVar4 = (psVar3->Mem).pPages;
      (psVar3->Mem).BookMarkH[0] = iVar2 << (bVar1 & 0x1f) | *ppiVar4[iVar2];
      iVar2 = (psVar3->Mem).iPage[1];
      (psVar3->Mem).BookMarkH[1] = iVar2 << (bVar1 & 0x1f) | *ppiVar4[iVar2];
      if (psVar3->activity2 != (word *)0x0) {
        psVar3->var_inc2 = psVar3->var_inc;
        memcpy(psVar3->activity2,psVar3->activity,(long)iVar5 << 3);
        pVVar7 = p->vPivot;
      }
      Gia_ManSetPhasePattern(p->pAig,pVVar7);
      Gia_ManSetPhasePattern(p->pCare,p->vPivot);
      iVar5 = Gia_ManCheckCoPhase(p->pCare);
      if (iVar5 == 0) {
        pVVar7 = Vec_IntAlloc(100);
        p->vDisPairs = pVVar7;
        pVVar7 = Vec_IntAlloc(100);
        p->vPattern = pVVar7;
        pVVar7 = Vec_IntAlloc(100);
        p->vFanins = pVVar7;
        pVVar7 = Vec_IntAlloc(100);
        p->vFront = pVVar7;
        Ssc_GiaClassesInit(pAig);
        return p;
      }
      uVar6 = Gia_ManCheckCoPhase(p->pCare);
      pSVar9 = (Ssc_Man_t *)0x0;
      printf("Computed reference pattern violates %d constraints (this is a bug!).\n",(ulong)uVar6);
      goto LAB_00513752;
    }
    pcVar8 = "Constraints are UNSAT.";
  }
  puts(pcVar8);
LAB_00513752:
  Ssc_ManStop(p);
  return pSVar9;
}

Assistant:

Ssc_Man_t * Ssc_ManStart( Gia_Man_t * pAig, Gia_Man_t * pCare, Ssc_Pars_t * pPars )
{
    Ssc_Man_t * p;
    p = ABC_CALLOC( Ssc_Man_t, 1 );
    p->pPars  = pPars;
    p->pAig   = pAig;
    p->pCare  = pCare;
    p->pFraig = Gia_ManDupDfs( p->pCare );
    assert( Vec_IntSize(&p->pFraig->vHTable) == 0 );
    assert( !Gia_ManHasDangling(p->pFraig) );
    Gia_ManInvertPos( p->pFraig );
    Ssc_ManStartSolver( p );
    if ( p->pSat == NULL )
    {
        printf( "Constraints are UNSAT after propagation.\n" );
        Ssc_ManStop( p );
        return (Ssc_Man_t *)(ABC_PTRINT_T)1;
    }
//    p->vPivot = Ssc_GiaFindPivotSim( p->pFraig );
//    Vec_IntFreeP( &p->vPivot  );
    p->vPivot = Ssc_ManFindPivotSat( p );
    if ( p->vPivot == (Vec_Int_t *)(ABC_PTRINT_T)1 )
    {
        printf( "Constraints are UNSAT.\n" );
        Ssc_ManStop( p );
        return (Ssc_Man_t *)(ABC_PTRINT_T)1;
    }
    if ( p->vPivot == NULL )
    {
        printf( "Conflict limit is reached while trying to find one SAT assignment.\n" );
        Ssc_ManStop( p );
        return NULL;
    }
    sat_solver_bookmark( p->pSat );
//    Vec_IntPrint( p->vPivot );
    Gia_ManSetPhasePattern( p->pAig, p->vPivot );
    Gia_ManSetPhasePattern( p->pCare, p->vPivot );
    if ( Gia_ManCheckCoPhase(p->pCare) )
    {
        printf( "Computed reference pattern violates %d constraints (this is a bug!).\n", Gia_ManCheckCoPhase(p->pCare) );
        Ssc_ManStop( p );
        return NULL;
    }
    // other things
    p->vDisPairs = Vec_IntAlloc( 100 );
    p->vPattern = Vec_IntAlloc( 100 );
    p->vFanins = Vec_IntAlloc( 100 );
    p->vFront = Vec_IntAlloc( 100 );
    Ssc_GiaClassesInit( pAig );
    // now it is ready for refinement using simulation 
    return p;
}